

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase257::run(TestCase257 *this)

{
  Builder value;
  Builder value_00;
  Builder value_01;
  Builder value_02;
  Builder builder_00;
  SegmentBuilder *pSVar1;
  CapTableBuilder *pCVar2;
  char *pcVar3;
  size_t sVar4;
  Branch *pBVar5;
  int iVar6;
  char *ptrCopy;
  bool bVar7;
  Builder root;
  MallocMessageBuilder builder;
  undefined8 uVar8;
  Builder *pBVar9;
  undefined8 uVar10;
  SegmentBuilder *pSVar11;
  SegmentBuilder *pSVar12;
  CapTableBuilder *pCVar13;
  CapTableBuilder *pCVar14;
  void *pvVar15;
  void *pvVar16;
  WirePointer *pWVar17;
  WirePointer *pWVar18;
  undefined8 uVar19;
  Builder local_268;
  StringTree local_248;
  undefined8 in_stack_fffffffffffffdf0;
  SegmentBuilder *in_stack_fffffffffffffdf8;
  CapTableBuilder *in_stack_fffffffffffffe00;
  void *in_stack_fffffffffffffe08;
  WirePointer *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe80;
  SegmentBuilder *in_stack_fffffffffffffe88;
  CapTableBuilder *in_stack_fffffffffffffe90;
  void *in_stack_fffffffffffffe98;
  WirePointer *in_stack_fffffffffffffea0;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_268,&local_120.super_MessageBuilder);
  local_248.text.content.size_ = (size_t)local_268.builder.pointer;
  local_248.size_ = (size_t)local_268.builder.segment;
  local_248.text.content.ptr = (char *)local_268.builder.capTable;
  PointerBuilder::initStruct
            ((StructBuilder *)&stack0xfffffffffffffdf8,(PointerBuilder *)&local_248,
             (StructSize)0x140006);
  uVar8 = 0x613328;
  value.builder.segment = in_stack_fffffffffffffdf8;
  value.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffdf0;
  value.builder.capTable = in_stack_fffffffffffffe00;
  value.builder.data = in_stack_fffffffffffffe08;
  value.builder.pointers = in_stack_fffffffffffffe10;
  value.builder.dataSize = (StructDataBitCount)in_stack_fffffffffffffe18;
  value.builder.pointerCount = SUB82(in_stack_fffffffffffffe18,4);
  value.builder._38_2_ = SUB82(in_stack_fffffffffffffe18,6);
  pSVar11 = in_stack_fffffffffffffdf8;
  pCVar13 = in_stack_fffffffffffffe00;
  pvVar15 = in_stack_fffffffffffffe08;
  pWVar17 = in_stack_fffffffffffffe10;
  uVar19 = in_stack_fffffffffffffe18;
  prettyPrint(value);
  kj::StringTree::flatten((String *)&local_268,&local_248);
  pCVar2 = local_268.builder.capTable;
  pSVar1 = local_268.builder.segment;
  bVar7 = true;
  if (local_268.builder.capTable == (CapTableBuilder *)0x110) {
    iVar6 = bcmp(local_268.builder.segment,
                 "( voidField = void,\n  boolField = false,\n  int8Field = 0,\n  int16Field = 0,\n  int32Field = 0,\n  int64Field = 0,\n  uInt8Field = 0,\n  uInt16Field = 0,\n  uInt32Field = 0,\n  uInt64Field = 0,\n  float32Field = 0,\n  float64Field = 0,\n  enumField = foo,\n  interfaceField = void )"
                 ,0x10f);
    bVar7 = iVar6 != 0;
  }
  if (pSVar1 != (SegmentBuilder *)0x0) {
    local_268.builder.segment = (SegmentBuilder *)0x0;
    local_268.builder.capTable = (CapTableBuilder *)0x0;
    (**(code **)*local_268.builder.pointer)
              (local_268.builder.pointer,pSVar1,1,pCVar2,pCVar2,0,uVar8,in_stack_fffffffffffffdf8,
               in_stack_fffffffffffffe00,in_stack_fffffffffffffe08,in_stack_fffffffffffffe10,
               in_stack_fffffffffffffe18);
  }
  sVar4 = local_248.branches.size_;
  pBVar5 = local_248.branches.ptr;
  if (local_248.branches.ptr != (Branch *)0x0) {
    local_248.branches.ptr = (Branch *)0x0;
    local_248.branches.size_ = 0;
    (**(local_248.branches.disposer)->_vptr_ArrayDisposer)
              (local_248.branches.disposer,pBVar5,0x40,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar4 = local_248.text.content.size_;
  pcVar3 = local_248.text.content.ptr;
  if ((CapTableBuilder *)local_248.text.content.ptr != (CapTableBuilder *)0x0) {
    local_248.text.content.ptr = (char *)0x0;
    local_248.text.content.size_ = 0;
    (**(local_248.text.content.disposer)->_vptr_ArrayDisposer)
              (local_248.text.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  if ((bool)(bVar7 & kj::_::Debug::minSeverity < 3)) {
    in_stack_fffffffffffffe80 = 0x613328;
    value_00.builder.segment = pSVar11;
    value_00.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffdf0;
    value_00.builder.capTable = pCVar13;
    value_00.builder.data = pvVar15;
    value_00.builder.pointers = pWVar17;
    value_00.builder.dataSize = (StructDataBitCount)uVar19;
    value_00.builder.pointerCount = SUB82(uVar19,4);
    value_00.builder._38_2_ = SUB82(uVar19,6);
    pSVar12 = pSVar11;
    pCVar14 = pCVar13;
    pvVar16 = pvVar15;
    pWVar18 = pWVar17;
    uVar8 = uVar19;
    in_stack_fffffffffffffe88 = pSVar11;
    in_stack_fffffffffffffe90 = pCVar13;
    in_stack_fffffffffffffe98 = pvVar15;
    in_stack_fffffffffffffea0 = pWVar17;
    prettyPrint(value_00);
    pBVar9 = &local_268;
    kj::StringTree::flatten((String *)pBVar9,&local_248);
    kj::_::Debug::log<char_const(&)[378],char_const(&)[272],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x113,ERROR,
               "\"failed: expected \" \"(\\\"( voidField = void,\\\\n\\\" \\\"  boolField = false,\\\\n\\\" \\\"  int8Field = 0,\\\\n\\\" \\\"  int16Field = 0,\\\\n\\\" \\\"  int32Field = 0,\\\\n\\\" \\\"  int64Field = 0,\\\\n\\\" \\\"  uInt8Field = 0,\\\\n\\\" \\\"  uInt16Field = 0,\\\\n\\\" \\\"  uInt32Field = 0,\\\\n\\\" \\\"  uInt64Field = 0,\\\\n\\\" \\\"  float32Field = 0,\\\\n\\\" \\\"  float64Field = 0,\\\\n\\\" \\\"  enumField = foo,\\\\n\\\" \\\"  interfaceField = void )\\\") == (prettyPrint(root).flatten())\", \"( voidField = void,\\n\" \"  boolField = false,\\n\" \"  int8Field = 0,\\n\" \"  int16Field = 0,\\n\" \"  int32Field = 0,\\n\" \"  int64Field = 0,\\n\" \"  uInt8Field = 0,\\n\" \"  uInt16Field = 0,\\n\" \"  uInt32Field = 0,\\n\" \"  uInt64Field = 0,\\n\" \"  float32Field = 0,\\n\" \"  float64Field = 0,\\n\" \"  enumField = foo,\\n\" \"  interfaceField = void )\", prettyPrint(root).flatten()"
               ,(char (*) [378])
                "failed: expected (\"( voidField = void,\\n\" \"  boolField = false,\\n\" \"  int8Field = 0,\\n\" \"  int16Field = 0,\\n\" \"  int32Field = 0,\\n\" \"  int64Field = 0,\\n\" \"  uInt8Field = 0,\\n\" \"  uInt16Field = 0,\\n\" \"  uInt32Field = 0,\\n\" \"  uInt64Field = 0,\\n\" \"  float32Field = 0,\\n\" \"  float64Field = 0,\\n\" \"  enumField = foo,\\n\" \"  interfaceField = void )\") == (prettyPrint(root).flatten())"
               ,(char (*) [272])
                "( voidField = void,\n  boolField = false,\n  int8Field = 0,\n  int16Field = 0,\n  int32Field = 0,\n  int64Field = 0,\n  uInt8Field = 0,\n  uInt16Field = 0,\n  uInt32Field = 0,\n  uInt64Field = 0,\n  float32Field = 0,\n  float64Field = 0,\n  enumField = foo,\n  interfaceField = void )"
               ,(String *)pBVar9);
    pCVar2 = local_268.builder.capTable;
    pSVar1 = local_268.builder.segment;
    if (local_268.builder.segment != (SegmentBuilder *)0x0) {
      local_268.builder.segment = (SegmentBuilder *)0x0;
      local_268.builder.capTable = (CapTableBuilder *)0x0;
      (**(code **)*local_268.builder.pointer)
                (local_268.builder.pointer,pSVar1,1,pCVar2,pCVar2,0,pBVar9,pSVar11,pCVar13,pvVar15,
                 pWVar17,uVar19);
    }
    uVar19 = uVar8;
    pWVar17 = pWVar18;
    pvVar15 = pvVar16;
    pCVar13 = pCVar14;
    pSVar11 = pSVar12;
    sVar4 = local_248.branches.size_;
    pBVar5 = local_248.branches.ptr;
    if (local_248.branches.ptr != (Branch *)0x0) {
      local_248.branches.ptr = (Branch *)0x0;
      local_248.branches.size_ = 0;
      (**(local_248.branches.disposer)->_vptr_ArrayDisposer)
                (local_248.branches.disposer,pBVar5,0x40,sVar4,sVar4,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    sVar4 = local_248.text.content.size_;
    pcVar3 = local_248.text.content.ptr;
    if ((CapTableBuilder *)local_248.text.content.ptr != (CapTableBuilder *)0x0) {
      local_248.text.content.ptr = (char *)0x0;
      local_248.text.content.size_ = 0;
      (**(local_248.text.content.disposer)->_vptr_ArrayDisposer)
                (local_248.text.content.disposer,pcVar3,1,sVar4,sVar4,0);
    }
  }
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffe88;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffe80;
  builder_00._builder.data = in_stack_fffffffffffffe90;
  builder_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffe98;
  builder_00._builder._32_8_ = in_stack_fffffffffffffea0;
  initTestMessage(builder_00);
  uVar10 = 0x613328;
  value_01.builder.segment = pSVar11;
  value_01.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffdf0;
  value_01.builder.capTable = pCVar13;
  value_01.builder.data = pvVar15;
  value_01.builder.pointers = pWVar17;
  value_01.builder.dataSize = (StructDataBitCount)uVar19;
  value_01.builder.pointerCount = SUB82(uVar19,4);
  value_01.builder._38_2_ = SUB82(uVar19,6);
  pSVar12 = pSVar11;
  pCVar14 = pCVar13;
  pvVar16 = pvVar15;
  pWVar18 = pWVar17;
  uVar8 = uVar19;
  prettyPrint(value_01);
  kj::StringTree::flatten((String *)&local_268,&local_248);
  pCVar2 = local_268.builder.capTable;
  pSVar1 = local_268.builder.segment;
  bVar7 = true;
  if (local_268.builder.capTable == (CapTableBuilder *)0x14a9) {
    iVar6 = bcmp(local_268.builder.segment,
                 "( voidField = void,\n  boolField = true,\n  int8Field = -123,\n  int16Field = -12345,\n  int32Field = -12345678,\n  int64Field = -123456789012345,\n  uInt8Field = 234,\n  uInt16Field = 45678,\n  uInt32Field = 3456789012,\n  uInt64Field = 12345678901234567890,\n  float32Field = 1234.5,\n  float64Field = -1.23e47,\n  textField = \"foo\",\n  dataField = \"bar\",\n  structField = (\n    voidField = void,\n    boolField = true,\n    int8Field = -12,\n    int16Field = 3456,\n    int32Field = -78901234,\n    int64Field = 56789012345678,\n    uInt8Field = 90,\n    uInt16Field = 1234,\n    uInt32Field = 56789012,\n    uInt64Field = 345678901234567890,\n    float32Field = -1.25e-10,\n    float64Field = 345,\n    textField = \"baz\",\n    dataField = \"qux\",\n    structField = (\n      voidField = void,\n      boolField = false,\n      int8Field = 0,\n      int16Field = 0,\n      int32Field = 0,\n      int64Field = 0,\n      uInt8Field = 0,\n      uInt16Field = 0,\n      uInt32Field = 0,\n      uInt64Field = 0,\n      float32Field = 0,\n      float64Field = 0,\n      textField = \"nested\",\n      structField = (\n        voidField = void,\n        boolField = false,\n        int8Field = 0,\n        int16Field = 0,\n        int32Field = 0,\n        int64Field = 0,\n        uInt8Field = 0,\n        uInt16Field = 0,\n        uInt32Field = 0,\n        uInt64Field = 0,\n        float32Field = 0,\n        float64Field = 0,\n        textField = \"really nested\",\n        enumField = foo,\n        interfaceField = void ),\n      enumField = foo,\n      interfaceField = void ),\n    enumField = baz,\n    interfaceField = void,\n    voidList = [void, void, void],\n    boolList = [false, true, false, true, true],\n    int8List = [12, -34, -128, 127],\n    int16List = [1234, -5678, -32768, 32767],\n    int32List = [12345678, -90123456, -2147483648, 2147483647],\n    int64List = [123456789012345, -678901234567890, -9223372036854775808, 9223372036854775807],\n    uInt8List = [12, 34, 0, 255],\n    uInt16List = [1234, 5678, 0, 65535],\n    uInt32List = [12345678, 90123456, 0, 4294967295],\n    uInt64List = [1234567890..." /* TRUNCATED STRING LITERAL */
                 ,0x14a8);
    bVar7 = iVar6 != 0;
  }
  if (pSVar1 != (SegmentBuilder *)0x0) {
    local_268.builder.segment = (SegmentBuilder *)0x0;
    local_268.builder.capTable = (CapTableBuilder *)0x0;
    (**(code **)*local_268.builder.pointer)
              (local_268.builder.pointer,pSVar1,1,pCVar2,pCVar2,0,uVar10,pSVar11,pCVar13,pvVar15,
               pWVar17,uVar19);
  }
  sVar4 = local_248.branches.size_;
  pBVar5 = local_248.branches.ptr;
  if (local_248.branches.ptr != (Branch *)0x0) {
    local_248.branches.ptr = (Branch *)0x0;
    local_248.branches.size_ = 0;
    (**(local_248.branches.disposer)->_vptr_ArrayDisposer)
              (local_248.branches.disposer,pBVar5,0x40,sVar4,sVar4,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar4 = local_248.text.content.size_;
  pcVar3 = local_248.text.content.ptr;
  if ((CapTableBuilder *)local_248.text.content.ptr != (CapTableBuilder *)0x0) {
    local_248.text.content.ptr = (char *)0x0;
    local_248.text.content.size_ = 0;
    (**(local_248.text.content.disposer)->_vptr_ArrayDisposer)
              (local_248.text.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  if ((bool)(bVar7 & kj::_::Debug::minSeverity < 3)) {
    value_02.builder.segment = pSVar12;
    value_02.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffdf0;
    value_02.builder.capTable = pCVar14;
    value_02.builder.data = pvVar16;
    value_02.builder.pointers = pWVar18;
    value_02.builder.dataSize = (StructDataBitCount)uVar8;
    value_02.builder.pointerCount = SUB82(uVar8,4);
    value_02.builder._38_2_ = SUB82(uVar8,6);
    prettyPrint(value_02);
    pBVar9 = &local_268;
    kj::StringTree::flatten((String *)pBVar9,&local_248);
    kj::_::Debug::log<char_const(&)[6138],char_const(&)[5289],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x1d4,ERROR,
               "\"failed: expected \" \"(\\\"( voidField = void,\\\\n\\\" \\\"  boolField = true,\\\\n\\\" \\\"  int8Field = -123,\\\\n\\\" \\\"  int16Field = -12345,\\\\n\\\" \\\"  int32Field = -12345678,\\\\n\\\" \\\"  int64Field = -123456789012345,\\\\n\\\" \\\"  uInt8Field = 234,\\\\n\\\" \\\"  uInt16Field = 45678,\\\\n\\\" \\\"  uInt32Field = 3456789012,\\\\n\\\" \\\"  uInt64Field = 12345678901234567890,\\\\n\\\" \\\"  float32Field = 1234.5,\\\\n\\\" \\\"  float64Field = -1.23e47,\\\\n\\\" \\\"  textField = \\\\\\\"foo\\\\\\\",\\\\n\\\" \\\"  dataField = \\\\\\\"bar\\\\\\\",\\\\n\\\" \\\"  structField = (\\\\n\\\" \\\"    voidField = void,\\\\n\\\" \\\"    boolField = true,\\\\n\\\" \\\"    int8Field = -12,\\\\n\\\" \\\"    int16Field = 3456,\\\\n\\\" \\\"    int32Field = -78901234,\\\\n\\\" \\\"    int64Field = 56789012345678,\\\\n\\\" \\\"    uInt8Field = 90,\\\\n\\\" \\\"    uInt16Field = 1234,\\\\n\\\" \\\"    uInt32Field = 56789012,\\\\n\\\" \\\"    uInt64Field = 345678901234567890,\\\\n\\\" \\\"    float32Field = -1.25e-10,\\\\n\\\" \\\"    float64Field = 345,\\\\n\\\" \\\"    textField = \\\\\\\"baz\\\\\\\",\\\\n\\\" \\\"    dataField = \\\\\\\"qux\\\\\\\",\\\\n\\\" \\\"    structField = (\\\\n\\\" \\\"      voidField = void,\\\\n\\\" \\\"      boolField = false,\\\\n\\\" \\\"      int8Field = 0,\\\\n\\\" \\\"      int16Field = 0,\\\\n\\\" \\\"      int32Field = 0,\\\\n\\\" \\\"      int64Field = 0,\\\\n\\\" \\\"      uInt8Field = 0,\\\\n\\\" \\\"      uInt16Field = 0,\\\\n\\\" \\\"      uInt32Field = 0,\\\\n\\\" \\\"      uInt64Field = 0,\\\\n\\\" \\\"      float32Field = 0,\\\\n\\\" \\\"      float64Field = 0,\\\\n\\\" \\\"      textField = \\\\\\\"nested\\\\\\\",\\\\n\\\" \\\"      structField = (\\\\n\\\" \\\"        voidField = void,\\\\n\\\" \\\"        boolField = false,\\\\n\\\" \\\"        int8Field = 0,\\\\n\\\" \\\"        int16Field = 0,\\\\n\\\" \\\"        int32Field = 0,\\\\n\\\" \\\"        int64Field = 0,\\\\n\\\" \\\"        uInt8Field = 0,\\\\n\\\" \\\"        uInt16Field = 0,\\\\n\\\" \\\"        uInt32Field = 0,\\\\n\\\" \\\"        uInt64Field = 0,\\\\n\\\" \\\"        float32Field = 0,\\\\n\\\" \\\"        float64Field = 0,\\\\n\\\" \\\"        textField = \\\\\\\"really nested\\\\\\\",\\\\n\\\" \\\"        enumField = foo,\\\\n\\\" \\\"        interfaceField = void ),\\\\n\\\" \\\"      enumField = foo,\\\\n\\\" \\\"      interfaceField = void ),\\\\n\\\" \\\"    enumField = baz,\\\\n\\\" \\\"    interfaceFiel..." /* TRUNCATED STRING LITERAL */
               ,(char (*) [6138])
                "failed: expected (\"( voidField = void,\\n\" \"  boolField = true,\\n\" \"  int8Field = -123,\\n\" \"  int16Field = -12345,\\n\" \"  int32Field = -12345678,\\n\" \"  int64Field = -123456789012345,\\n\" \"  uInt8Field = 234,\\n\" \"  uInt16Field = 45678,\\n\" \"  uInt32Field = 3456789012,\\n\" \"  uInt64Field = 12345678901234567890,\\n\" \"  float32Field = 1234.5,\\n\" \"  float64Field = -1.23e47,\\n\" \"  textField = \\\"foo\\\",\\n\" \"  dataField = \\\"bar\\\",\\n\" \"  structField = (\\n\" \"    voidField = void,\\n\" \"    boolField = true,\\n\" \"    int8Field = -12,\\n\" \"    int16Field = 3456,\\n\" \"    int32Field = -78901234,\\n\" \"    int64Field = 56789012345678,\\n\" \"    uInt8Field = 90,\\n\" \"    uInt16Field = 1234,\\n\" \"    uInt32Field = 56789012,\\n\" \"    uInt64Field = 345678901234567890,\\n\" \"    float32Field = -1.25e-10,\\n\" \"    float64Field = 345,\\n\" \"    textField = \\\"baz\\\",\\n\" \"    dataField = \\\"qux\\\",\\n\" \"    structField = (\\n\" \"      voidField = void,\\n\" \"      boolField = false,\\n\" \"      int8Field = 0,\\n\" \"      int16Field = 0,\\n\" \"      int32Field = 0,\\n\" \"      int64Field = 0,\\n\" \"      uInt8Field = 0,\\n\" \"      uInt16Field = 0,\\n\" \"      uInt32Field = 0,\\n\" \"      uInt64Field = 0,\\n\" \"      float32Field = 0,\\n\" \"      float64Field = 0,\\n\" \"      textField = \\\"nested\\\",\\n\" \"      structField = (\\n\" \"        voidField = void,\\n\" \"        boolField = false,\\n\" \"        int8Field = 0,\\n\" \"        int16Field = 0,\\n\" \"        int32Field = 0,\\n\" \"        int64Field = 0,\\n\" \"        uInt8Field = 0,\\n\" \"        uInt16Field = 0,\\n\" \"        uInt32Field = 0,\\n\" \"        uInt64Field = 0,\\n\" \"        float32Field = 0,\\n\" \"        float64Field = 0,\\n\" \"        textField = \\\"really nested\\\",\\n\" \"        enumField = foo,\\n\" \"        interfaceField = void ),\\n\" \"      enumField = foo,\\n\" \"      interfaceField = void ),\\n\" \"    enumField = baz,\\n\" \"    interfaceField = void,\\n\" \"    voidList = [void, void, void],\\n\" \"    boolList = [false, true, false, true, true],\\n\" \"    int8List = [12, -34, -128, 127],\\n\" \"    int16List = [1234, -5678, -32768, 32767],\\n\" \"    int32List = [1..." /* TRUNCATED STRING LITERAL */
               ,(char (*) [5289])
                "( voidField = void,\n  boolField = true,\n  int8Field = -123,\n  int16Field = -12345,\n  int32Field = -12345678,\n  int64Field = -123456789012345,\n  uInt8Field = 234,\n  uInt16Field = 45678,\n  uInt32Field = 3456789012,\n  uInt64Field = 12345678901234567890,\n  float32Field = 1234.5,\n  float64Field = -1.23e47,\n  textField = \"foo\",\n  dataField = \"bar\",\n  structField = (\n    voidField = void,\n    boolField = true,\n    int8Field = -12,\n    int16Field = 3456,\n    int32Field = -78901234,\n    int64Field = 56789012345678,\n    uInt8Field = 90,\n    uInt16Field = 1234,\n    uInt32Field = 56789012,\n    uInt64Field = 345678901234567890,\n    float32Field = -1.25e-10,\n    float64Field = 345,\n    textField = \"baz\",\n    dataField = \"qux\",\n    structField = (\n      voidField = void,\n      boolField = false,\n      int8Field = 0,\n      int16Field = 0,\n      int32Field = 0,\n      int64Field = 0,\n      uInt8Field = 0,\n      uInt16Field = 0,\n      uInt32Field = 0,\n      uInt64Field = 0,\n      float32Field = 0,\n      float64Field = 0,\n      textField = \"nested\",\n      structField = (\n        voidField = void,\n        boolField = false,\n        int8Field = 0,\n        int16Field = 0,\n        int32Field = 0,\n        int64Field = 0,\n        uInt8Field = 0,\n        uInt16Field = 0,\n        uInt32Field = 0,\n        uInt64Field = 0,\n        float32Field = 0,\n        float64Field = 0,\n        textField = \"really nested\",\n        enumField = foo,\n        interfaceField = void ),\n      enumField = foo,\n      interfaceField = void ),\n    enumField = baz,\n    interfaceField = void,\n    voidList = [void, void, void],\n    boolList = [false, true, false, true, true],\n    int8List = [12, -34, -128, 127],\n    int16List = [1234, -5678, -32768, 32767],\n    int32List = [12345678, -90123456, -2147483648, 2147483647],\n    int64List = [123456789012345, -678901234567890, -9223372036854775808, 9223372036854775807],\n    uInt8List = [12, 34, 0, 255],\n    uInt16List = [1234, 5678, 0, 65535],\n    uInt32List = [12345678, 90123456, 0, 4294967295],\n    uInt64List = [1234567890..." /* TRUNCATED STRING LITERAL */
               ,(String *)pBVar9);
    pCVar2 = local_268.builder.capTable;
    pSVar1 = local_268.builder.segment;
    if (local_268.builder.segment != (SegmentBuilder *)0x0) {
      local_268.builder.segment = (SegmentBuilder *)0x0;
      local_268.builder.capTable = (CapTableBuilder *)0x0;
      (**(code **)*local_268.builder.pointer)
                (local_268.builder.pointer,pSVar1,1,pCVar2,pCVar2,0,pBVar9,pSVar12,pCVar14,pvVar16,
                 pWVar18,uVar8);
    }
    sVar4 = local_248.branches.size_;
    pBVar5 = local_248.branches.ptr;
    if (local_248.branches.ptr != (Branch *)0x0) {
      local_248.branches.ptr = (Branch *)0x0;
      local_248.branches.size_ = 0;
      (**(local_248.branches.disposer)->_vptr_ArrayDisposer)
                (local_248.branches.disposer,pBVar5,0x40,sVar4,sVar4,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    sVar4 = local_248.text.content.size_;
    pcVar3 = local_248.text.content.ptr;
    if ((CapTableBuilder *)local_248.text.content.ptr != (CapTableBuilder *)0x0) {
      local_248.text.content.ptr = (char *)0x0;
      local_248.text.content.size_ = 0;
      (**(local_248.text.content.disposer)->_vptr_ArrayDisposer)
                (local_248.text.content.disposer,pcVar3,1,sVar4,sVar4,0);
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(Stringify, PrettyPrint) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  EXPECT_EQ(
      "( voidField = void,\n"
      "  boolField = false,\n"
      "  int8Field = 0,\n"
      "  int16Field = 0,\n"
      "  int32Field = 0,\n"
      "  int64Field = 0,\n"
      "  uInt8Field = 0,\n"
      "  uInt16Field = 0,\n"
      "  uInt32Field = 0,\n"
      "  uInt64Field = 0,\n"
      "  float32Field = 0,\n"
      "  float64Field = 0,\n"
      "  enumField = foo,\n"
      "  interfaceField = void )", prettyPrint(root).flatten());

  initTestMessage(root);

  EXPECT_EQ(
      "( voidField = void,\n"
      "  boolField = true,\n"
      "  int8Field = -123,\n"
      "  int16Field = -12345,\n"
      "  int32Field = -12345678,\n"
      "  int64Field = -123456789012345,\n"
      "  uInt8Field = 234,\n"
      "  uInt16Field = 45678,\n"
      "  uInt32Field = 3456789012,\n"
      "  uInt64Field = 12345678901234567890,\n"
      "  float32Field = 1234.5,\n"
      "  float64Field = -1.23e47,\n"
      "  textField = \"foo\",\n"
      "  dataField = \"bar\",\n"
      "  structField = (\n"
      "    voidField = void,\n"
      "    boolField = true,\n"
      "    int8Field = -12,\n"
      "    int16Field = 3456,\n"
      "    int32Field = -78901234,\n"
      "    int64Field = 56789012345678,\n"
      "    uInt8Field = 90,\n"
      "    uInt16Field = 1234,\n"
      "    uInt32Field = 56789012,\n"
      "    uInt64Field = 345678901234567890,\n"
      "    float32Field = -1.25e-10,\n"
      "    float64Field = 345,\n"
      "    textField = \"baz\",\n"
      "    dataField = \"qux\",\n"
      "    structField = (\n"
      "      voidField = void,\n"
      "      boolField = false,\n"
      "      int8Field = 0,\n"
      "      int16Field = 0,\n"
      "      int32Field = 0,\n"
      "      int64Field = 0,\n"
      "      uInt8Field = 0,\n"
      "      uInt16Field = 0,\n"
      "      uInt32Field = 0,\n"
      "      uInt64Field = 0,\n"
      "      float32Field = 0,\n"
      "      float64Field = 0,\n"
      "      textField = \"nested\",\n"
      "      structField = (\n"
      "        voidField = void,\n"
      "        boolField = false,\n"
      "        int8Field = 0,\n"
      "        int16Field = 0,\n"
      "        int32Field = 0,\n"
      "        int64Field = 0,\n"
      "        uInt8Field = 0,\n"
      "        uInt16Field = 0,\n"
      "        uInt32Field = 0,\n"
      "        uInt64Field = 0,\n"
      "        float32Field = 0,\n"
      "        float64Field = 0,\n"
      "        textField = \"really nested\",\n"
      "        enumField = foo,\n"
      "        interfaceField = void ),\n"
      "      enumField = foo,\n"
      "      interfaceField = void ),\n"
      "    enumField = baz,\n"
      "    interfaceField = void,\n"
      "    voidList = [void, void, void],\n"
      "    boolList = [false, true, false, true, true],\n"
      "    int8List = [12, -34, -128, 127],\n"
      "    int16List = [1234, -5678, -32768, 32767],\n"
      "    int32List = [12345678, -90123456, -2147483648, 2147483647],\n"
      "    int64List = [123456789012345, -678901234567890, "
                       "-9223372036854775808, 9223372036854775807],\n"
      "    uInt8List = [12, 34, 0, 255],\n"
      "    uInt16List = [1234, 5678, 0, 65535],\n"
      "    uInt32List = [12345678, 90123456, 0, 4294967295],\n"
      "    uInt64List = [123456789012345, 678901234567890, 0, 18446744073709551615],\n"
      "    float32List = [0, 1234567, 1e37, -1e37, 1e-37, -1e-37],\n"
      "    float64List = [0, 123456789012345, 1e306, -1e306, 1e-306, -1e-306],\n"
      "    textList = [\"quux\", \"corge\", \"grault\"],\n"
      "    dataList = [\"garply\", \"waldo\", \"fred\"],\n"
      "    structList = [\n"
      "      ( voidField = void,\n"
      "        boolField = false,\n"
      "        int8Field = 0,\n"
      "        int16Field = 0,\n"
      "        int32Field = 0,\n"
      "        int64Field = 0,\n"
      "        uInt8Field = 0,\n"
      "        uInt16Field = 0,\n"
      "        uInt32Field = 0,\n"
      "        uInt64Field = 0,\n"
      "        float32Field = 0,\n"
      "        float64Field = 0,\n"
      "        textField = \"x structlist 1\",\n"
      "        enumField = foo,\n"
      "        interfaceField = void ),\n"
      "      ( voidField = void,\n"
      "        boolField = false,\n"
      "        int8Field = 0,\n"
      "        int16Field = 0,\n"
      "        int32Field = 0,\n"
      "        int64Field = 0,\n"
      "        uInt8Field = 0,\n"
      "        uInt16Field = 0,\n"
      "        uInt32Field = 0,\n"
      "        uInt64Field = 0,\n"
      "        float32Field = 0,\n"
      "        float64Field = 0,\n"
      "        textField = \"x structlist 2\",\n"
      "        enumField = foo,\n"
      "        interfaceField = void ),\n"
      "      ( voidField = void,\n"
      "        boolField = false,\n"
      "        int8Field = 0,\n"
      "        int16Field = 0,\n"
      "        int32Field = 0,\n"
      "        int64Field = 0,\n"
      "        uInt8Field = 0,\n"
      "        uInt16Field = 0,\n"
      "        uInt32Field = 0,\n"
      "        uInt64Field = 0,\n"
      "        float32Field = 0,\n"
      "        float64Field = 0,\n"
      "        textField = \"x structlist 3\",\n"
      "        enumField = foo,\n"
      "        interfaceField = void ) ],\n"
      "    enumList = [qux, bar, grault] ),\n"
      "  enumField = corge,\n"
      "  interfaceField = void,\n"
      "  voidList = [void, void, void, void, void, void],\n"
      "  boolList = [true, false, false, true],\n"
      "  int8List = [111, -111],\n"
      "  int16List = [11111, -11111],\n"
      "  int32List = [111111111, -111111111],\n"
      "  int64List = [1111111111111111111, -1111111111111111111],\n"
      "  uInt8List = [111, 222],\n"
      "  uInt16List = [33333, 44444],\n"
      "  uInt32List = [3333333333],\n"
      "  uInt64List = [11111111111111111111],\n"
      "  float32List = [5555.5, inf, -inf, nan],\n"
      "  float64List = [7777.75, inf, -inf, nan],\n"
      "  textList = [\"plugh\", \"xyzzy\", \"thud\"],\n"
      "  dataList = [\"oops\", \"exhausted\", \"rfc3092\"],\n"
      "  structList = [\n"
      "    ( voidField = void,\n"
      "      boolField = false,\n"
      "      int8Field = 0,\n"
      "      int16Field = 0,\n"
      "      int32Field = 0,\n"
      "      int64Field = 0,\n"
      "      uInt8Field = 0,\n"
      "      uInt16Field = 0,\n"
      "      uInt32Field = 0,\n"
      "      uInt64Field = 0,\n"
      "      float32Field = 0,\n"
      "      float64Field = 0,\n"
      "      textField = \"structlist 1\",\n"
      "      enumField = foo,\n"
      "      interfaceField = void ),\n"
      "    ( voidField = void,\n"
      "      boolField = false,\n"
      "      int8Field = 0,\n"
      "      int16Field = 0,\n"
      "      int32Field = 0,\n"
      "      int64Field = 0,\n"
      "      uInt8Field = 0,\n"
      "      uInt16Field = 0,\n"
      "      uInt32Field = 0,\n"
      "      uInt64Field = 0,\n"
      "      float32Field = 0,\n"
      "      float64Field = 0,\n"
      "      textField = \"structlist 2\",\n"
      "      enumField = foo,\n"
      "      interfaceField = void ),\n"
      "    ( voidField = void,\n"
      "      boolField = false,\n"
      "      int8Field = 0,\n"
      "      int16Field = 0,\n"
      "      int32Field = 0,\n"
      "      int64Field = 0,\n"
      "      uInt8Field = 0,\n"
      "      uInt16Field = 0,\n"
      "      uInt32Field = 0,\n"
      "      uInt64Field = 0,\n"
      "      float32Field = 0,\n"
      "      float64Field = 0,\n"
      "      textField = \"structlist 3\",\n"
      "      enumField = foo,\n"
      "      interfaceField = void ) ],\n"
      "  enumList = [foo, garply] )",
      prettyPrint(root).flatten());
}